

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 (*pauVar21) [16];
  undefined1 auVar22 [32];
  ulong *puVar23;
  byte bVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  ulong *puVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  uint uVar63;
  uint uVar64;
  uint uVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  float fVar69;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  NodeRef stack [564];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  float local_1340;
  float fStack_133c;
  float fStack_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float fStack_1328;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  fVar66 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar36._4_4_ = fVar66;
  auVar36._0_4_ = fVar66;
  auVar36._8_4_ = fVar66;
  auVar36._12_4_ = fVar66;
  auVar36._16_4_ = fVar66;
  auVar36._20_4_ = fVar66;
  auVar36._24_4_ = fVar66;
  auVar36._28_4_ = fVar66;
  fVar67 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar37._4_4_ = fVar67;
  auVar37._0_4_ = fVar67;
  auVar37._8_4_ = fVar67;
  auVar37._12_4_ = fVar67;
  auVar37._16_4_ = fVar67;
  auVar37._20_4_ = fVar67;
  auVar37._24_4_ = fVar67;
  auVar37._28_4_ = fVar67;
  fVar68 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar38._4_4_ = fVar68;
  auVar38._0_4_ = fVar68;
  auVar38._8_4_ = fVar68;
  auVar38._12_4_ = fVar68;
  auVar38._16_4_ = fVar68;
  auVar38._20_4_ = fVar68;
  auVar38._24_4_ = fVar68;
  auVar38._28_4_ = fVar68;
  fVar66 = fVar66 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar67 = fVar67 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar68 = fVar68 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar45._0_8_ = CONCAT44(fVar66,fVar66) ^ 0x8000000080000000;
  auVar45._8_4_ = -fVar66;
  auVar45._12_4_ = -fVar66;
  auVar45._16_4_ = -fVar66;
  auVar45._20_4_ = -fVar66;
  auVar45._24_4_ = -fVar66;
  auVar45._28_4_ = -fVar66;
  auVar46._0_8_ = CONCAT44(fVar67,fVar67) ^ 0x8000000080000000;
  auVar46._8_4_ = -fVar67;
  auVar46._12_4_ = -fVar67;
  auVar46._16_4_ = -fVar67;
  auVar46._20_4_ = -fVar67;
  auVar46._24_4_ = -fVar67;
  auVar46._28_4_ = -fVar67;
  auVar47._0_8_ = CONCAT44(fVar68,fVar68) ^ 0x8000000080000000;
  auVar47._8_4_ = -fVar68;
  auVar47._12_4_ = -fVar68;
  auVar47._16_4_ = -fVar68;
  auVar47._20_4_ = -fVar68;
  auVar47._24_4_ = -fVar68;
  auVar47._28_4_ = -fVar68;
  iVar25 = (tray->tnear).field_0.i[k];
  auVar48._4_4_ = iVar25;
  auVar48._0_4_ = iVar25;
  auVar48._8_4_ = iVar25;
  auVar48._12_4_ = iVar25;
  auVar48._16_4_ = iVar25;
  auVar48._20_4_ = iVar25;
  auVar48._24_4_ = iVar25;
  auVar48._28_4_ = iVar25;
  iVar25 = (tray->tfar).field_0.i[k];
  auVar49._4_4_ = iVar25;
  auVar49._0_4_ = iVar25;
  auVar49._8_4_ = iVar25;
  auVar49._12_4_ = iVar25;
  auVar49._16_4_ = iVar25;
  auVar49._20_4_ = iVar25;
  auVar49._24_4_ = iVar25;
  auVar49._28_4_ = iVar25;
  auVar40._8_4_ = 0x7fffffff;
  auVar40._0_8_ = 0x7fffffff7fffffff;
  auVar40._12_4_ = 0x7fffffff;
  auVar40._16_4_ = 0x7fffffff;
  auVar40._20_4_ = 0x7fffffff;
  auVar40._24_4_ = 0x7fffffff;
  auVar40._28_4_ = 0x7fffffff;
  puVar35 = local_11f8;
LAB_0166f9b6:
  do {
    puVar23 = puVar35;
    if (puVar23 == &local_1200) {
LAB_0166fe9f:
      return puVar23 != &local_1200;
    }
    puVar35 = puVar23 + -1;
    uVar31 = puVar23[-1];
    while ((uVar31 & 8) == 0) {
      auVar39 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar31 + 0x40 + uVar28),auVar45,auVar36);
      auVar10 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar31 + 0x40 + uVar29),auVar46,auVar37);
      auVar53 = vpmaxsd_avx2(ZEXT1632(auVar39),ZEXT1632(auVar10));
      auVar39 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar31 + 0x40 + uVar30),auVar47,auVar38);
      auVar41 = vpmaxsd_avx2(ZEXT1632(auVar39),auVar48);
      auVar53 = vpmaxsd_avx2(auVar53,auVar41);
      auVar39 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar31 + 0x40 + (uVar28 ^ 0x20)),auVar45,
                                auVar36);
      auVar10 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar31 + 0x40 + (uVar29 ^ 0x20)),auVar46,
                                auVar37);
      auVar41 = vpminsd_avx2(ZEXT1632(auVar39),ZEXT1632(auVar10));
      auVar39 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar31 + 0x40 + (uVar30 ^ 0x20)),auVar47,
                                auVar38);
      auVar7 = vpminsd_avx2(ZEXT1632(auVar39),auVar49);
      auVar41 = vpminsd_avx2(auVar41,auVar7);
      auVar53 = vpcmpgtd_avx2(auVar53,auVar41);
      iVar25 = vmovmskps_avx(auVar53);
      if (iVar25 == 0xff) goto LAB_0166f9b6;
      bVar24 = ~(byte)iVar25;
      uVar26 = uVar31 & 0xfffffffffffffff0;
      lVar27 = 0;
      for (uVar31 = (ulong)bVar24; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar31 = *(ulong *)(uVar26 + lVar27 * 8);
      uVar32 = bVar24 - 1 & (uint)bVar24;
      uVar33 = (ulong)uVar32;
      if (uVar32 != 0) {
        do {
          *puVar35 = uVar31;
          puVar35 = puVar35 + 1;
          lVar27 = 0;
          for (uVar31 = uVar33; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
            lVar27 = lVar27 + 1;
          }
          uVar33 = uVar33 - 1 & uVar33;
          uVar31 = *(ulong *)(uVar26 + lVar27 * 8);
        } while (uVar33 != 0);
      }
    }
    uVar26 = uVar31 & 0xfffffffffffffff0;
    for (lVar27 = 0; lVar27 != (ulong)((uint)uVar31 & 0xf) - 8; lVar27 = lVar27 + 1) {
      lVar34 = lVar27 * 0xe0;
      lVar1 = uVar26 + 0xc0 + lVar34;
      local_1220 = *(undefined8 *)(lVar1 + 0x10);
      uStack_1218 = *(undefined8 *)(lVar1 + 0x18);
      uStack_1210 = local_1220;
      uStack_1208 = uStack_1218;
      auVar61._16_16_ = *(undefined1 (*) [16])(uVar26 + 0x60 + lVar34);
      auVar61._0_16_ = *(undefined1 (*) [16])(uVar26 + lVar34);
      auVar60._16_16_ = *(undefined1 (*) [16])(uVar26 + 0x70 + lVar34);
      auVar60._0_16_ = *(undefined1 (*) [16])(uVar26 + 0x10 + lVar34);
      auVar55._16_16_ = *(undefined1 (*) [16])(uVar26 + 0x80 + lVar34);
      auVar55._0_16_ = *(undefined1 (*) [16])(uVar26 + 0x20 + lVar34);
      auVar39 = *(undefined1 (*) [16])(uVar26 + 0x30 + lVar34);
      auVar41._16_16_ = auVar39;
      auVar41._0_16_ = auVar39;
      auVar39 = *(undefined1 (*) [16])(uVar26 + 0x40 + lVar34);
      auVar56._16_16_ = auVar39;
      auVar56._0_16_ = auVar39;
      auVar39 = *(undefined1 (*) [16])(uVar26 + 0x50 + lVar34);
      auVar54._16_16_ = auVar39;
      auVar54._0_16_ = auVar39;
      lVar1 = uVar26 + 0x90 + lVar34;
      pauVar21 = (undefined1 (*) [16])(lVar1 + 0x10);
      local_1360._16_8_ = *(undefined8 *)*pauVar21;
      local_1360._0_16_ = *pauVar21;
      local_1360._24_8_ = *(undefined8 *)(lVar1 + 0x18);
      auVar39 = *(undefined1 (*) [16])(uVar26 + 0xa0 + lVar34);
      auVar70._16_16_ = auVar39;
      auVar70._0_16_ = auVar39;
      lVar34 = uVar26 + 0xb0 + lVar34;
      pauVar21 = (undefined1 (*) [16])(lVar34 + 0x10);
      local_1380._24_8_ = *(undefined8 *)(lVar34 + 0x18);
      local_1380._16_8_ = *(undefined8 *)*pauVar21;
      local_1380._0_16_ = *pauVar21;
      auVar41 = vsubps_avx(auVar61,auVar41);
      auVar53 = vsubps_avx(auVar60,auVar56);
      auVar7 = vsubps_avx(auVar55,auVar54);
      auVar54 = vsubps_avx(local_1360,auVar61);
      auVar3 = vsubps_avx(auVar70,auVar60);
      auVar4 = vsubps_avx(local_1380,auVar55);
      auVar5._4_4_ = auVar53._4_4_ * auVar4._4_4_;
      auVar5._0_4_ = auVar53._0_4_ * auVar4._0_4_;
      auVar5._8_4_ = auVar53._8_4_ * auVar4._8_4_;
      auVar5._12_4_ = auVar53._12_4_ * auVar4._12_4_;
      auVar5._16_4_ = auVar53._16_4_ * auVar4._16_4_;
      auVar5._20_4_ = auVar53._20_4_ * auVar4._20_4_;
      auVar5._24_4_ = auVar53._24_4_ * auVar4._24_4_;
      auVar5._28_4_ = auVar53._28_4_;
      auVar12 = vfmsub231ps_fma(auVar5,auVar3,auVar7);
      auVar6._4_4_ = auVar7._4_4_ * auVar54._4_4_;
      auVar6._0_4_ = auVar7._0_4_ * auVar54._0_4_;
      auVar6._8_4_ = auVar7._8_4_ * auVar54._8_4_;
      auVar6._12_4_ = auVar7._12_4_ * auVar54._12_4_;
      auVar6._16_4_ = auVar7._16_4_ * auVar54._16_4_;
      auVar6._20_4_ = auVar7._20_4_ * auVar54._20_4_;
      auVar6._24_4_ = auVar7._24_4_ * auVar54._24_4_;
      auVar6._28_4_ = (int)((ulong)local_1380._24_8_ >> 0x20);
      auVar13 = vfmsub231ps_fma(auVar6,auVar4,auVar41);
      uVar2 = *(undefined4 *)(ray + k * 4);
      auVar42._4_4_ = uVar2;
      auVar42._0_4_ = uVar2;
      auVar42._8_4_ = uVar2;
      auVar42._12_4_ = uVar2;
      auVar42._16_4_ = uVar2;
      auVar42._20_4_ = uVar2;
      auVar42._24_4_ = uVar2;
      auVar42._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar71._4_4_ = uVar2;
      auVar71._0_4_ = uVar2;
      auVar71._8_4_ = uVar2;
      auVar71._12_4_ = uVar2;
      auVar71._16_4_ = uVar2;
      auVar71._20_4_ = uVar2;
      auVar71._24_4_ = uVar2;
      auVar71._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar50._4_4_ = uVar2;
      auVar50._0_4_ = uVar2;
      auVar50._8_4_ = uVar2;
      auVar50._12_4_ = uVar2;
      auVar50._16_4_ = uVar2;
      auVar50._20_4_ = uVar2;
      auVar50._24_4_ = uVar2;
      auVar50._28_4_ = uVar2;
      fVar66 = *(float *)(ray + k * 4 + 0x40);
      auVar57._4_4_ = fVar66;
      auVar57._0_4_ = fVar66;
      auVar57._8_4_ = fVar66;
      auVar57._12_4_ = fVar66;
      auVar57._16_4_ = fVar66;
      auVar57._20_4_ = fVar66;
      auVar57._24_4_ = fVar66;
      auVar57._28_4_ = fVar66;
      auVar5 = vsubps_avx(auVar61,auVar42);
      fVar67 = *(float *)(ray + k * 4 + 0x50);
      auVar43._4_4_ = fVar67;
      auVar43._0_4_ = fVar67;
      auVar43._8_4_ = fVar67;
      auVar43._12_4_ = fVar67;
      auVar43._16_4_ = fVar67;
      auVar43._20_4_ = fVar67;
      auVar43._24_4_ = fVar67;
      auVar43._28_4_ = fVar67;
      auVar6 = vsubps_avx(auVar60,auVar71);
      fVar68 = *(float *)(ray + k * 4 + 0x60);
      auVar62._4_4_ = fVar68;
      auVar62._0_4_ = fVar68;
      auVar62._8_4_ = fVar68;
      auVar62._12_4_ = fVar68;
      auVar62._16_4_ = fVar68;
      auVar62._20_4_ = fVar68;
      auVar62._24_4_ = fVar68;
      auVar62._28_4_ = fVar68;
      auVar42 = vsubps_avx(auVar55,auVar50);
      auVar16._4_4_ = fVar66 * auVar6._4_4_;
      auVar16._0_4_ = fVar66 * auVar6._0_4_;
      auVar16._8_4_ = fVar66 * auVar6._8_4_;
      auVar16._12_4_ = fVar66 * auVar6._12_4_;
      auVar16._16_4_ = fVar66 * auVar6._16_4_;
      auVar16._20_4_ = fVar66 * auVar6._20_4_;
      auVar16._24_4_ = fVar66 * auVar6._24_4_;
      auVar16._28_4_ = uVar2;
      auVar39 = vfmsub231ps_fma(auVar16,auVar5,auVar43);
      auVar17._4_4_ = auVar4._4_4_ * auVar39._4_4_;
      auVar17._0_4_ = auVar4._0_4_ * auVar39._0_4_;
      auVar17._8_4_ = auVar4._8_4_ * auVar39._8_4_;
      auVar17._12_4_ = auVar4._12_4_ * auVar39._12_4_;
      auVar17._16_4_ = auVar4._16_4_ * 0.0;
      auVar17._20_4_ = auVar4._20_4_ * 0.0;
      auVar17._24_4_ = auVar4._24_4_ * 0.0;
      auVar17._28_4_ = auVar4._28_4_;
      auVar51._0_4_ = auVar39._0_4_ * auVar7._0_4_;
      auVar51._4_4_ = auVar39._4_4_ * auVar7._4_4_;
      auVar51._8_4_ = auVar39._8_4_ * auVar7._8_4_;
      auVar51._12_4_ = auVar39._12_4_ * auVar7._12_4_;
      auVar51._16_4_ = auVar7._16_4_ * 0.0;
      auVar51._20_4_ = auVar7._20_4_ * 0.0;
      auVar51._24_4_ = auVar7._24_4_ * 0.0;
      auVar51._28_4_ = 0;
      auVar7._4_4_ = fVar68 * auVar5._4_4_;
      auVar7._0_4_ = fVar68 * auVar5._0_4_;
      auVar7._8_4_ = fVar68 * auVar5._8_4_;
      auVar7._12_4_ = fVar68 * auVar5._12_4_;
      auVar7._16_4_ = fVar68 * auVar5._16_4_;
      auVar7._20_4_ = fVar68 * auVar5._20_4_;
      auVar7._24_4_ = fVar68 * auVar5._24_4_;
      auVar7._28_4_ = auVar5._28_4_;
      auVar10 = vfmsub231ps_fma(auVar7,auVar42,auVar57);
      auVar39 = vfmadd231ps_fma(auVar17,ZEXT1632(auVar10),auVar3);
      auVar10 = vfmadd231ps_fma(auVar51,auVar53,ZEXT1632(auVar10));
      local_1340 = auVar41._0_4_;
      fStack_133c = auVar41._4_4_;
      fStack_1338 = auVar41._8_4_;
      fStack_1334 = auVar41._12_4_;
      fStack_1330 = auVar41._16_4_;
      fStack_132c = auVar41._20_4_;
      fStack_1328 = auVar41._24_4_;
      auVar4._4_4_ = auVar3._4_4_ * fStack_133c;
      auVar4._0_4_ = auVar3._0_4_ * local_1340;
      auVar4._8_4_ = auVar3._8_4_ * fStack_1338;
      auVar4._12_4_ = auVar3._12_4_ * fStack_1334;
      auVar4._16_4_ = auVar3._16_4_ * fStack_1330;
      auVar4._20_4_ = auVar3._20_4_ * fStack_132c;
      auVar4._24_4_ = auVar3._24_4_ * fStack_1328;
      auVar4._28_4_ = fVar67;
      auVar14 = vfmsub231ps_fma(auVar4,auVar54,auVar53);
      auVar53._4_4_ = fVar67 * auVar42._4_4_;
      auVar53._0_4_ = fVar67 * auVar42._0_4_;
      auVar53._8_4_ = fVar67 * auVar42._8_4_;
      auVar53._12_4_ = fVar67 * auVar42._12_4_;
      auVar53._16_4_ = fVar67 * auVar42._16_4_;
      auVar53._20_4_ = fVar67 * auVar42._20_4_;
      auVar53._24_4_ = fVar67 * auVar42._24_4_;
      auVar53._28_4_ = auVar3._28_4_;
      auVar15 = vfmsub231ps_fma(auVar53,auVar62,auVar6);
      auVar3._4_4_ = fVar68 * auVar14._4_4_;
      auVar3._0_4_ = fVar68 * auVar14._0_4_;
      auVar3._8_4_ = fVar68 * auVar14._8_4_;
      auVar3._12_4_ = fVar68 * auVar14._12_4_;
      auVar3._16_4_ = fVar68 * 0.0;
      auVar3._20_4_ = fVar68 * 0.0;
      auVar3._24_4_ = fVar68 * 0.0;
      auVar3._28_4_ = auVar42._28_4_;
      auVar11 = vfmadd231ps_fma(auVar3,auVar43,ZEXT1632(auVar13));
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar57,ZEXT1632(auVar12));
      auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),ZEXT1632(auVar15),auVar54);
      auVar22._8_4_ = 0x80000000;
      auVar22._0_8_ = 0x8000000080000000;
      auVar22._12_4_ = 0x80000000;
      auVar22._16_4_ = 0x80000000;
      auVar22._20_4_ = 0x80000000;
      auVar22._24_4_ = 0x80000000;
      auVar22._28_4_ = 0x80000000;
      auVar53 = vandps_avx(ZEXT1632(auVar11),auVar22);
      uVar32 = auVar53._0_4_;
      auVar58._0_4_ = (float)(uVar32 ^ auVar39._0_4_);
      uVar63 = auVar53._4_4_;
      auVar58._4_4_ = (float)(uVar63 ^ auVar39._4_4_);
      uVar64 = auVar53._8_4_;
      auVar58._8_4_ = (float)(uVar64 ^ auVar39._8_4_);
      uVar65 = auVar53._12_4_;
      auVar58._12_4_ = (float)(uVar65 ^ auVar39._12_4_);
      fVar66 = auVar53._16_4_;
      auVar58._16_4_ = fVar66;
      fVar67 = auVar53._20_4_;
      auVar58._20_4_ = fVar67;
      fVar68 = auVar53._24_4_;
      auVar58._24_4_ = fVar68;
      fVar69 = auVar53._28_4_;
      auVar58._28_4_ = fVar69;
      auVar39 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar15),auVar41);
      auVar52._0_4_ = (float)(uVar32 ^ auVar39._0_4_);
      auVar52._4_4_ = (float)(uVar63 ^ auVar39._4_4_);
      auVar52._8_4_ = (float)(uVar64 ^ auVar39._8_4_);
      auVar52._12_4_ = (float)(uVar65 ^ auVar39._12_4_);
      auVar52._16_4_ = fVar66;
      auVar52._20_4_ = fVar67;
      auVar52._24_4_ = fVar68;
      auVar52._28_4_ = fVar69;
      auVar53 = vcmpps_avx(auVar58,ZEXT832(0) << 0x20,5);
      auVar41 = vcmpps_avx(auVar52,ZEXT832(0) << 0x20,5);
      auVar53 = vandps_avx(auVar53,auVar41);
      auVar41 = vcmpps_avx(ZEXT1632(auVar11),ZEXT832(0) << 0x20,4);
      auVar53 = vandps_avx(auVar53,auVar41);
      auVar59._0_4_ = auVar58._0_4_ + auVar52._0_4_;
      auVar59._4_4_ = auVar58._4_4_ + auVar52._4_4_;
      auVar59._8_4_ = auVar58._8_4_ + auVar52._8_4_;
      auVar59._12_4_ = auVar58._12_4_ + auVar52._12_4_;
      auVar59._16_4_ = fVar66 + fVar66;
      auVar59._20_4_ = fVar67 + fVar67;
      auVar59._24_4_ = fVar68 + fVar68;
      auVar59._28_4_ = fVar69 + fVar69;
      auVar41 = vandps_avx(ZEXT1632(auVar11),auVar40);
      auVar7 = vcmpps_avx(auVar59,auVar41,2);
      auVar3 = auVar7 & auVar53;
      if ((((((((auVar3 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar3 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar3 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar3 >> 0x7f,0) != '\0') ||
            (auVar3 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar3 >> 0xbf,0) != '\0') ||
          (auVar3 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar3[0x1f] < '\0')
      {
        auVar53 = vandps_avx(auVar53,auVar7);
        auVar39 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
        auVar18._4_4_ = auVar14._4_4_ * auVar42._4_4_;
        auVar18._0_4_ = auVar14._0_4_ * auVar42._0_4_;
        auVar18._8_4_ = auVar14._8_4_ * auVar42._8_4_;
        auVar18._12_4_ = auVar14._12_4_ * auVar42._12_4_;
        auVar18._16_4_ = auVar42._16_4_ * 0.0;
        auVar18._20_4_ = auVar42._20_4_ * 0.0;
        auVar18._24_4_ = auVar42._24_4_ * 0.0;
        auVar18._28_4_ = auVar54._28_4_;
        auVar10 = vfmadd132ps_fma(auVar6,auVar18,ZEXT1632(auVar13));
        auVar10 = vfmadd132ps_fma(auVar5,ZEXT1632(auVar10),ZEXT1632(auVar12));
        auVar44._0_4_ = uVar32 ^ auVar10._0_4_;
        auVar44._4_4_ = uVar63 ^ auVar10._4_4_;
        auVar44._8_4_ = uVar64 ^ auVar10._8_4_;
        auVar44._12_4_ = uVar65 ^ auVar10._12_4_;
        auVar44._16_4_ = fVar66;
        auVar44._20_4_ = fVar67;
        auVar44._24_4_ = fVar68;
        auVar44._28_4_ = fVar69;
        fVar66 = *(float *)(ray + k * 4 + 0x30);
        auVar19._4_4_ = auVar41._4_4_ * fVar66;
        auVar19._0_4_ = auVar41._0_4_ * fVar66;
        auVar19._8_4_ = auVar41._8_4_ * fVar66;
        auVar19._12_4_ = auVar41._12_4_ * fVar66;
        auVar19._16_4_ = auVar41._16_4_ * fVar66;
        auVar19._20_4_ = auVar41._20_4_ * fVar66;
        auVar19._24_4_ = auVar41._24_4_ * fVar66;
        auVar19._28_4_ = fVar66;
        auVar53 = vcmpps_avx(auVar19,auVar44,1);
        fVar66 = *(float *)(ray + k * 4 + 0x80);
        auVar20._4_4_ = auVar41._4_4_ * fVar66;
        auVar20._0_4_ = auVar41._0_4_ * fVar66;
        auVar20._8_4_ = auVar41._8_4_ * fVar66;
        auVar20._12_4_ = auVar41._12_4_ * fVar66;
        auVar20._16_4_ = auVar41._16_4_ * fVar66;
        auVar20._20_4_ = auVar41._20_4_ * fVar66;
        auVar20._24_4_ = auVar41._24_4_ * fVar66;
        auVar20._28_4_ = auVar41._28_4_;
        auVar41 = vcmpps_avx(auVar44,auVar20,2);
        auVar53 = vandps_avx(auVar53,auVar41);
        auVar10 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
        auVar39 = vpand_avx(auVar39,auVar10);
        auVar53 = vpmovzxwd_avx2(auVar39);
        auVar53 = vpslld_avx2(auVar53,0x1f);
        if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar53 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar53 >> 0x7f,0) != '\0') ||
              (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar53 >> 0xbf,0) != '\0') ||
            (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar53[0x1f] < '\0') {
          auVar39 = vpsllw_avx(auVar39,0xf);
          auVar39 = vpacksswb_avx(auVar39,auVar39);
          uVar33 = (ulong)(byte)(SUB161(auVar39 >> 7,0) & 1 | (SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar39 >> 0x3f,0) << 7);
          do {
            uVar8 = 0;
            for (uVar9 = uVar33; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
              uVar8 = uVar8 + 1;
            }
            if ((((context->scene->geometries).items[*(uint *)((long)&local_1220 + uVar8 * 4)].ptr)
                 ->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
              goto LAB_0166fe9f;
            }
            uVar33 = uVar33 ^ 1L << (uVar8 & 0x3f);
          } while (uVar33 != 0);
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }